

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

vrna_exp_param_t * get_exp_params_ali(vrna_md_t *md,uint n_seq,double pfs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vrna_exp_param_t *pvVar5;
  long lVar6;
  size_t sVar7;
  int (*paaiVar8) [5] [5];
  long lVar9;
  int (*paaiVar10) [5] [5];
  int (*paaiVar11) [5] [5];
  int m_1;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  double (*padVar15) [5];
  double (*padVar16) [8];
  int (*paaiVar17) [5] [5];
  double (*paaadVar18) [8] [5] [5];
  double (*paaadVar19) [8] [5] [5];
  double (*paaadVar20) [8] [5] [5];
  double (*paaaadVar21) [8] [5] [5] [5];
  double (*paaaadVar22) [8] [5] [5] [5];
  double (*paaaadVar23) [8] [5] [5] [5];
  double (*paaaadVar24) [8] [5] [5] [5];
  int (*paaiVar25) [5] [5];
  int (*paaiVar26) [5] [5];
  int (*paaiVar27) [5] [5];
  int (*paaiVar28) [5] [5];
  int (*paaiVar29) [5] [5];
  int (*paaiVar30) [5] [5];
  int (*paiVar31) [5];
  vrna_exp_param_t *pvVar32;
  vrna_exp_param_t *pvVar33;
  int (*paaaaiVar34) [8] [5] [5] [5];
  int (*paiVar35) [5];
  double (*paaaaadVar36) [8] [5] [5] [5] [5];
  double (*paaaaadVar37) [8] [5] [5] [5] [5];
  double (*paaaaadVar38) [8] [5] [5] [5] [5];
  double (*paaaaadVar39) [8] [5] [5] [5] [5];
  double (*paaaaadVar40) [8] [5] [5] [5] [5];
  int m;
  int iVar41;
  int (*paiVar42) [5];
  int (*paaiVar43) [5] [5];
  long lVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  int (*paiVar48) [8];
  int (*paaiVar49) [5] [5];
  int (*paaaiVar50) [8] [5] [5];
  int (*paaaaaiVar51) [8] [5] [5] [5] [5];
  int (*paiVar52) [5];
  int (*paiVar53) [5];
  int (*paiVar54) [8];
  long lVar55;
  int (*paaaiVar56) [8] [5] [5];
  int (*paaaaiVar57) [8] [5] [5] [5];
  int (*paaaaaiVar58) [8] [5] [5] [5] [5];
  int (*paiVar59) [5];
  int (*paiVar60) [5];
  int (*paiVar61) [5];
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  int (*local_108) [5];
  int (*local_100) [5];
  int (*local_f0) [5];
  int (*local_e8) [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  int (*local_c8) [5];
  int (*local_b8) [5];
  int (*local_b0) [5];
  
  pvVar5 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memcpy(&pvVar5->model_details,md,0x7e8);
  dVar62 = md->betaScale;
  pvVar5->alpha = dVar62;
  dVar66 = md->temperature;
  pvVar5->temperature = dVar66;
  pvVar5->pf_scale = pfs;
  dVar66 = dVar66 + 273.15;
  dVar62 = dVar62 * (double)n_seq * dVar66 * 1.98717;
  pvVar5->kT = dVar62;
  iVar1 = md->pf_smooth;
  dVar66 = dVar66 / Tmeasure;
  pvVar5->lxc = lxc37 * dVar66;
  dVar63 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar66;
  if (iVar1 == 0) {
    dVar63 = (double)(int)dVar63;
  }
  dVar63 = exp((dVar63 * -10.0) / dVar62);
  pvVar5->expDuplexInit = dVar63;
  dVar63 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar66;
  if (iVar1 == 0) {
    dVar63 = (double)(int)dVar63;
  }
  dVar63 = exp((dVar63 * -10.0) / dVar62);
  pvVar5->expTermAU = dVar63;
  dVar63 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar66;
  if (iVar1 == 0) {
    dVar63 = (double)(int)dVar63;
  }
  dVar63 = exp(((dVar63 * -10.0) / dVar62) / (double)n_seq);
  pvVar5->expMLbase = dVar63;
  dVar63 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar66;
  if (iVar1 == 0) {
    dVar63 = (double)(int)dVar63;
  }
  dVar63 = exp((dVar63 * -10.0) / dVar62);
  pvVar5->expMLclosing = dVar63;
  dVar63 = (double)GQuadLayerMismatchH -
           (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar66;
  if (iVar1 == 0) {
    dVar63 = (double)(int)dVar63;
  }
  dVar63 = exp((dVar63 * -10.0) / dVar62);
  pvVar5->expgquadLayerMismatch = dVar63;
  pvVar5->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_100 = (int (*) [5])(pvVar5->expgquad[2] + 3);
  lVar6 = 2;
  do {
    lVar47 = 0;
    do {
      iVar3 = GQuadBetadH;
      iVar4 = GQuadAlphadH;
      iVar41 = GQuadAlphadH - GQuadAlpha37;
      iVar12 = GQuadBetadH - GQuadBeta37;
      lVar55 = lVar47 + 1;
      dVar63 = log((double)(int)lVar55);
      dVar63 = ((double)iVar3 - (double)iVar12 * dVar66) * dVar63 +
               ((double)iVar4 - (double)iVar41 * dVar66) * (double)((int)lVar6 - 1);
      if (iVar1 == 0) {
        dVar63 = (double)(int)dVar63;
      }
      dVar63 = exp((dVar63 * -10.0) / dVar62);
      *(double *)((long)local_100 + lVar47 * 8) = dVar63;
      lVar47 = lVar55;
    } while (lVar55 != 0x2b);
    lVar6 = lVar6 + 1;
    local_100 = (int (*) [5])((long)local_100 + 0x170);
  } while (lVar6 != 8);
  lVar6 = 0;
  do {
    dVar63 = (double)hairpindH[lVar6] - (double)(hairpindH[lVar6] - hairpin37[lVar6]) * dVar66;
    if (iVar1 == 0) {
      dVar63 = (double)(int)dVar63;
    }
    dVar63 = exp((dVar63 * -10.0) / dVar62);
    pvVar5->exphairpin[lVar6] = dVar63;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1f);
  lVar6 = 0;
  do {
    dVar63 = exp((dVar66 * -600.0 * 10.0) / dVar62);
    pvVar5->exphairpin[lVar6] = dVar63;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    dVar63 = (double)*(int *)((long)bulgedH + lVar6) -
             (double)(*(int *)((long)bulgedH + lVar6) - *(int *)((long)bulge37 + lVar6)) * dVar66;
    if (iVar1 == 0) {
      dVar63 = (double)(int)dVar63;
    }
    dVar63 = exp((dVar63 * -10.0) / dVar62);
    *(double *)((long)pvVar5->expbulge + lVar6 * 2) = dVar63;
    dVar63 = (double)*(int *)((long)internal_loopdH + lVar6) -
             (double)(*(int *)((long)internal_loopdH + lVar6) -
                     *(int *)((long)internal_loop37 + lVar6)) * dVar66;
    if (iVar1 == 0) {
      dVar63 = (double)(int)dVar63;
    }
    dVar63 = exp((dVar63 * -10.0) / dVar62);
    *(double *)((long)pvVar5->expinternal + lVar6 * 2) = dVar63;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x7c);
  if (james_rule != 0) {
    dVar63 = exp(-800.0 / dVar62);
    pvVar5->expinternal[2] = dVar63;
  }
  dVar63 = (double)niniodH;
  iVar4 = niniodH - ninio37;
  lVar6 = 0;
  do {
    dVar65 = (double)(int)lVar6 * (dVar63 - (double)iVar4 * dVar66);
    dVar64 = (double)MAX_NINIO;
    if (dVar65 <= (double)MAX_NINIO) {
      dVar64 = dVar65;
    }
    dVar64 = exp((dVar64 * -10.0) / dVar62);
    pvVar5->expninio[2][lVar6] = dVar64;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1f);
  if (Tetraloops[0] != '\0') {
    uVar14 = 0;
    uVar46 = 7;
    do {
      dVar63 = (double)TetraloopdH[uVar14] -
               (double)(TetraloopdH[uVar14] - Tetraloop37[uVar14]) * dVar66;
      if (iVar1 == 0) {
        dVar63 = (double)(int)dVar63;
      }
      dVar63 = exp((dVar63 * -10.0) / dVar62);
      pvVar5->exptetra[uVar14] = dVar63;
      uVar14 = (ulong)((int)uVar14 + 1);
      sVar7 = strlen(Tetraloops);
      bVar2 = uVar46 < sVar7;
      uVar46 = (ulong)((int)uVar46 + 7);
    } while (bVar2);
  }
  if (Triloops[0] != '\0') {
    uVar14 = 0;
    uVar46 = 5;
    do {
      dVar63 = (double)TriloopdH[uVar14] - (double)(TriloopdH[uVar14] - Triloop37[uVar14]) * dVar66;
      if (iVar1 == 0) {
        dVar63 = (double)(int)dVar63;
      }
      dVar63 = exp((dVar63 * -10.0) / dVar62);
      pvVar5->exptri[uVar14] = dVar63;
      uVar14 = (ulong)((int)uVar14 + 1);
      sVar7 = strlen(Triloops);
      bVar2 = uVar46 < sVar7;
      uVar46 = (ulong)((int)uVar46 + 5);
    } while (bVar2);
  }
  if (Hexaloops[0] != '\0') {
    uVar13 = 0;
    uVar46 = 9;
    do {
      dVar63 = (double)HexaloopdH[uVar13] -
               (double)(HexaloopdH[uVar13] - Hexaloop37[uVar13]) * dVar66;
      if (iVar1 == 0) {
        dVar63 = (double)(int)dVar63;
      }
      dVar63 = exp((dVar63 * -10.0) / dVar62);
      pvVar5->exphex[uVar13] = dVar63;
      uVar13 = uVar13 + 1;
      sVar7 = strlen(Hexaloops);
      bVar2 = uVar46 < sVar7;
      uVar46 = (ulong)((int)uVar46 + 9);
    } while (bVar2);
  }
  lVar6 = 0xc7fb;
  do {
    dVar63 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar66;
    if (iVar1 == 0) {
      dVar63 = (double)(int)dVar63;
    }
    dVar63 = exp((dVar63 * -10.0) / dVar62);
    *(double *)((long)(pvVar5->expstack + -1) + 0x38 + lVar6 * 8) = dVar63;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xc803);
  padVar15 = pvVar5->expdangle5;
  local_108 = dangle5_dH;
  paiVar53 = dangle5_37;
  paiVar31 = dangle3_dH;
  paiVar42 = dangle3_37;
  lVar6 = 0;
  do {
    lVar47 = 0;
    do {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar15 + lVar47 * 2) = 0x3ff0000000000000;
        dVar63 = 1.0;
      }
      else {
        iVar4 = *(int *)((long)*local_108 + lVar47);
        dVar63 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar53 + lVar47)) * dVar66;
        if (iVar1 == 0) {
          dVar64 = 0.0;
          if ((int)dVar63 < 1) {
            dVar64 = -(double)(int)dVar63;
          }
        }
        else {
          dVar65 = dVar63 / -10.0;
          dVar64 = 0.0;
          if (-1.2283697 <= dVar65) {
            if (dVar65 <= 0.8660254) {
              dVar63 = sin(dVar65 + -0.34242663);
              iVar4 = *(int *)((long)*local_108 + lVar47);
              dVar64 = sin(((double)iVar4 -
                           (double)(iVar4 - *(int *)((long)*paiVar53 + lVar47)) * dVar66) / -10.0 +
                           -0.34242663);
              dVar64 = (dVar64 + 1.0) * (dVar63 + 1.0) * 3.8490018;
            }
            else {
              dVar64 = -dVar63;
            }
          }
        }
        dVar63 = exp((dVar64 * 10.0) / dVar62);
        *(double *)((long)*padVar15 + lVar47 * 2) = dVar63;
        iVar4 = *(int *)((long)*paiVar31 + lVar47);
        dVar63 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar42 + lVar47)) * dVar66;
        if (iVar1 == 0) {
          dVar64 = 0.0;
          if ((int)dVar63 < 1) {
            dVar64 = -(double)(int)dVar63;
          }
        }
        else {
          dVar65 = dVar63 / -10.0;
          dVar64 = 0.0;
          if (-1.2283697 <= dVar65) {
            if (dVar65 <= 0.8660254) {
              dVar63 = sin(dVar65 + -0.34242663);
              iVar4 = *(int *)((long)*paiVar31 + lVar47);
              dVar64 = sin(((double)iVar4 -
                           (double)(iVar4 - *(int *)((long)*paiVar42 + lVar47)) * dVar66) / -10.0 +
                           -0.34242663);
              dVar64 = (dVar64 + 1.0) * (dVar63 + 1.0) * 3.8490018;
            }
            else {
              dVar64 = -dVar63;
            }
          }
        }
        dVar63 = exp((dVar64 * 10.0) / dVar62);
      }
      *(double *)((long)padVar15[8] + lVar47 * 2) = dVar63;
      lVar47 = lVar47 + 4;
    } while (lVar47 != 0x14);
    lVar6 = lVar6 + 1;
    padVar15 = padVar15 + 1;
    local_108 = local_108 + 1;
    paiVar53 = paiVar53 + 1;
    paiVar31 = paiVar31 + 1;
    paiVar42 = paiVar42 + 1;
  } while (lVar6 != 8);
  padVar16 = pvVar5->expstack;
  paiVar48 = stackdH;
  paiVar54 = stack37;
  lVar6 = 0;
  do {
    lVar47 = 0;
    do {
      iVar4 = *(int *)((long)*paiVar48 + lVar47);
      dVar63 = (double)iVar4 - (double)(iVar4 - *(int *)((long)*paiVar54 + lVar47)) * dVar66;
      if (iVar1 == 0) {
        dVar63 = (double)(int)dVar63;
      }
      dVar63 = exp((dVar63 * -10.0) / dVar62);
      *(double *)((long)*padVar16 + lVar47 * 2) = dVar63;
      lVar47 = lVar47 + 4;
    } while (lVar47 != 0x20);
    lVar6 = lVar6 + 1;
    paiVar48 = paiVar48 + 1;
    paiVar54 = paiVar54 + 1;
    padVar16 = padVar16 + 1;
  } while (lVar6 != 8);
  paaiVar43 = mismatchIdH;
  paaiVar17 = mismatchI37;
  paaiVar49 = mismatch1nIdH;
  paaiVar8 = mismatch1nI37;
  paaiVar10 = mismatchHdH;
  paaiVar11 = mismatchH37;
  paaiVar25 = mismatch23IdH;
  paaiVar26 = mismatch23I37;
  paaiVar27 = mismatchMdH;
  paaiVar28 = mismatchM37;
  paaiVar29 = mismatchExtdH;
  paaiVar30 = mismatchExt37;
  lVar6 = 0;
  pvVar32 = pvVar5;
  do {
    lVar47 = 0;
    paiVar31 = *paaiVar17;
    pvVar33 = pvVar32;
    paiVar42 = *paaiVar43;
    paiVar53 = *paaiVar49;
    local_108 = *paaiVar26;
    local_100 = *paaiVar25;
    local_f0 = *paaiVar11;
    local_e8 = *paaiVar10;
    local_e0 = *paaiVar29;
    local_d8 = *paaiVar30;
    local_c8 = *paaiVar8;
    local_b8 = *paaiVar27;
    local_b0 = *paaiVar28;
    do {
      lVar55 = 0;
      do {
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar42 + lVar55);
        dVar63 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*paiVar31 + lVar55)) * dVar66;
        if (iVar1 == 0) {
          dVar63 = (double)(int)dVar63;
        }
        dVar63 = exp((dVar63 * -10.0) / dVar62);
        *(double *)((long)pvVar33->expmismatchI[0][0] + lVar55 * 2) = dVar63;
        iVar4 = *(int *)((long)*(int (*) [5])*paiVar53 + lVar55);
        dVar63 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_c8 + lVar55)) * dVar66;
        if (iVar1 == 0) {
          dVar63 = (double)(int)dVar63;
        }
        dVar63 = exp((dVar63 * -10.0) / dVar62);
        *(double *)((long)pvVar33->expmismatch1nI[0][0] + lVar55 * 2) = dVar63;
        iVar4 = *(int *)((long)*(int (*) [5])*local_e8 + lVar55);
        dVar63 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_f0 + lVar55)) * dVar66;
        if (iVar1 == 0) {
          dVar63 = (double)(int)dVar63;
        }
        dVar63 = exp((dVar63 * -10.0) / dVar62);
        *(double *)((long)pvVar33->expmismatchH[0][0] + lVar55 * 2) = dVar63;
        iVar4 = *(int *)((long)*(int (*) [5])*local_100 + lVar55);
        dVar63 = (double)iVar4 -
                 (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_108 + lVar55)) * dVar66;
        if (iVar1 == 0) {
          dVar63 = (double)(int)dVar63;
        }
        dVar63 = exp((dVar63 * -10.0) / dVar62);
        *(double *)((long)pvVar33->expmismatch23I[0][0] + lVar55 * 2) = dVar63;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar33->expmismatchExt[0][0] + lVar55 * 2) = 0x3ff0000000000000;
          lVar9 = 0x2430;
          dVar63 = 1.0;
        }
        else {
          iVar4 = *(int *)((long)*(int (*) [5])*local_b8 + lVar55);
          dVar63 = (double)iVar4 -
                   (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_b0 + lVar55)) * dVar66;
          if (iVar1 == 0) {
            dVar64 = 0.0;
            if ((int)dVar63 < 1) {
              dVar64 = -(double)(int)dVar63;
            }
          }
          else {
            dVar65 = dVar63 / -10.0;
            dVar64 = 0.0;
            if (-1.2283697 <= dVar65) {
              if (dVar65 <= 0.8660254) {
                dVar63 = sin(dVar65 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_b8 + lVar55);
                dVar64 = sin(((double)iVar4 -
                             (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_b0 + lVar55)) *
                             dVar66) / -10.0 + -0.34242663);
                dVar64 = (dVar64 + 1.0) * (dVar63 + 1.0) * 3.8490018;
              }
              else {
                dVar64 = -dVar63;
              }
            }
          }
          dVar63 = exp((dVar64 * 10.0) / dVar62);
          *(double *)((long)pvVar33->expmismatchM[0][0] + lVar55 * 2) = dVar63;
          iVar4 = *(int *)((long)*(int (*) [5])*local_e0 + lVar55);
          dVar63 = (double)iVar4 -
                   (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_d8 + lVar55)) * dVar66;
          if (iVar1 == 0) {
            dVar64 = 0.0;
            if ((int)dVar63 < 1) {
              dVar64 = -(double)(int)dVar63;
            }
          }
          else {
            dVar65 = dVar63 / -10.0;
            dVar64 = 0.0;
            if (-1.2283697 <= dVar65) {
              if (dVar65 <= 0.8660254) {
                dVar63 = sin(dVar65 + -0.34242663);
                iVar4 = *(int *)((long)*(int (*) [5])*local_e0 + lVar55);
                dVar64 = sin(((double)iVar4 -
                             (double)(iVar4 - *(int *)((long)*(int (*) [5])*local_d8 + lVar55)) *
                             dVar66) / -10.0 + -0.34242663);
                dVar64 = (dVar64 + 1.0) * (dVar63 + 1.0) * 3.8490018;
              }
              else {
                dVar64 = -dVar63;
              }
            }
          }
          dVar63 = exp((dVar64 * 10.0) / dVar62);
          lVar9 = 0x4f0;
        }
        *(double *)((long)(pvVar33->expstack + -1) + 0x38 + lVar55 * 2 + lVar9) = dVar63;
        lVar55 = lVar55 + 4;
      } while (lVar55 != 0x14);
      lVar47 = lVar47 + 1;
      pvVar33 = (vrna_exp_param_t *)(pvVar33->expstack[0] + 4);
      paiVar42 = paiVar42 + 1;
      paiVar31 = paiVar31 + 1;
      paiVar53 = paiVar53 + 1;
      local_c8 = local_c8 + 1;
      local_e8 = local_e8 + 1;
      local_f0 = local_f0 + 1;
      local_100 = local_100 + 1;
      local_108 = local_108 + 1;
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + 1;
      local_e0 = local_e0 + 1;
      local_d8 = local_d8 + 1;
    } while (lVar47 != 5);
    lVar6 = lVar6 + 1;
    pvVar32 = (vrna_exp_param_t *)(pvVar32->expstack + 3);
    paaiVar43 = (int (*) [5] [5])((long)paaiVar43 + 100);
    paaiVar17 = (int (*) [5] [5])((long)paaiVar17 + 100);
    paaiVar49 = (int (*) [5] [5])((long)paaiVar49 + 100);
    paaiVar8 = (int (*) [5] [5])((long)paaiVar8 + 100);
    paaiVar10 = (int (*) [5] [5])((long)paaiVar10 + 100);
    paaiVar11 = (int (*) [5] [5])((long)paaiVar11 + 100);
    paaiVar25 = (int (*) [5] [5])((long)paaiVar25 + 100);
    paaiVar26 = (int (*) [5] [5])((long)paaiVar26 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
    paaiVar28 = (int (*) [5] [5])((long)paaiVar28 + 100);
    paaiVar29 = (int (*) [5] [5])((long)paaiVar29 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
  } while (lVar6 != 8);
  paaadVar18 = pvVar5->expint11;
  paaaiVar50 = int11_dH;
  paaaiVar56 = int11_37;
  lVar6 = 0;
  do {
    lVar47 = 0;
    paaadVar19 = paaadVar18;
    paiVar31 = (int (*) [5])paaaiVar50;
    paiVar42 = (int (*) [5])paaaiVar56;
    do {
      lVar55 = 0;
      paaadVar20 = paaadVar19;
      paiVar53 = paiVar31;
      paiVar59 = paiVar42;
      do {
        lVar9 = 0;
        do {
          iVar4 = (*(int (*) [5] [5])*paiVar53)[0][lVar9];
          dVar63 = (double)iVar4 -
                   (double)(iVar4 - (*(int (*) [5] [5])*paiVar59)[0][lVar9]) * dVar66;
          if (iVar1 == 0) {
            dVar63 = (double)(int)dVar63;
          }
          dVar63 = exp((dVar63 * -10.0) / dVar62);
          (*paaadVar20)[0][0][lVar9] = dVar63;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 5);
        lVar55 = lVar55 + 1;
        paiVar53 = paiVar53 + 1;
        paiVar59 = paiVar59 + 1;
        paaadVar20 = (double (*) [8] [5] [5])((*paaadVar20)[0] + 1);
      } while (lVar55 != 5);
      lVar47 = lVar47 + 1;
      paiVar31 = paiVar31 + 5;
      paiVar42 = paiVar42 + 5;
      paaadVar19 = (double (*) [8] [5] [5])(*paaadVar19 + 1);
    } while (lVar47 != 8);
    lVar6 = lVar6 + 1;
    paaaiVar50 = (int (*) [8] [5] [5])((long)paaaiVar50 + 800);
    paaaiVar56 = (int (*) [8] [5] [5])((long)paaaiVar56 + 800);
    paaadVar18 = paaadVar18 + 1;
  } while (lVar6 != 8);
  paaaadVar21 = pvVar5->expint21;
  paaaaiVar34 = int21_dH;
  paaaaiVar57 = int21_37;
  lVar6 = 0;
  do {
    lVar47 = 0;
    paaaadVar22 = paaaadVar21;
    paiVar31 = (int (*) [5])paaaaiVar34;
    paiVar42 = (int (*) [5])paaaaiVar57;
    do {
      lVar55 = 0;
      paaaadVar23 = paaaadVar22;
      paiVar53 = paiVar31;
      paiVar59 = paiVar42;
      do {
        lVar9 = 0;
        paaaadVar24 = paaaadVar23;
        paiVar35 = paiVar53;
        paiVar60 = paiVar59;
        do {
          lVar44 = 0;
          do {
            iVar4 = (*(int (*) [5] [5] [5])*paiVar35)[0][0][lVar44];
            dVar63 = (double)iVar4 -
                     (double)(iVar4 - (*(int (*) [5] [5] [5])*paiVar60)[0][0][lVar44]) * dVar66;
            if (iVar1 == 0) {
              dVar63 = (double)(int)dVar63;
            }
            dVar63 = exp((dVar63 * -10.0) / dVar62);
            (*paaaadVar24)[0][0][0][lVar44] = dVar63;
            lVar44 = lVar44 + 1;
          } while (lVar44 != 5);
          lVar9 = lVar9 + 1;
          paiVar35 = paiVar35 + 1;
          paiVar60 = paiVar60 + 1;
          paaaadVar24 = (double (*) [8] [5] [5] [5])((*paaaadVar24)[0][0] + 1);
        } while (lVar9 != 5);
        lVar55 = lVar55 + 1;
        paiVar53 = paiVar53 + 5;
        paiVar59 = paiVar59 + 5;
        paaaadVar23 = (double (*) [8] [5] [5] [5])((*paaaadVar23)[0] + 1);
      } while (lVar55 != 5);
      lVar47 = lVar47 + 1;
      paiVar31 = paiVar31 + 0x19;
      paiVar42 = paiVar42 + 0x19;
      paaaadVar22 = (double (*) [8] [5] [5] [5])(*paaaadVar22 + 1);
    } while (lVar47 != 8);
    lVar6 = lVar6 + 1;
    paaaaiVar34 = (int (*) [8] [5] [5] [5])((long)paaaaiVar34 + 4000);
    paaaaiVar57 = (int (*) [8] [5] [5] [5])((long)paaaaiVar57 + 4000);
    paaaadVar21 = paaaadVar21 + 1;
  } while (lVar6 != 8);
  paaaaadVar36 = pvVar5->expint22;
  paaaaaiVar51 = int22_dH;
  paaaaaiVar58 = int22_37;
  lVar6 = 0;
  do {
    lVar47 = 0;
    paaaaadVar37 = paaaaadVar36;
    paiVar31 = (int (*) [5])paaaaaiVar51;
    paiVar42 = (int (*) [5])paaaaaiVar58;
    do {
      lVar55 = 0;
      paaaaadVar38 = paaaaadVar37;
      paiVar53 = paiVar31;
      paiVar59 = paiVar42;
      do {
        lVar9 = 0;
        paaaaadVar39 = paaaaadVar38;
        paiVar35 = paiVar53;
        paiVar60 = paiVar59;
        do {
          lVar44 = 0;
          paaaaadVar40 = paaaaadVar39;
          paiVar52 = paiVar35;
          paiVar61 = paiVar60;
          do {
            lVar45 = 0;
            do {
              iVar4 = (*(int (*) [5] [5] [5] [5])*paiVar52)[0][0][0][lVar45];
              dVar63 = (double)iVar4 -
                       (double)(iVar4 - (*(int (*) [5] [5] [5] [5])*paiVar61)[0][0][0][lVar45]) *
                       dVar66;
              if (iVar1 == 0) {
                dVar63 = (double)(int)dVar63;
              }
              dVar63 = exp((dVar63 * -10.0) / dVar62);
              (*paaaaadVar40)[0][0][0][0][lVar45] = dVar63;
              lVar45 = lVar45 + 1;
            } while (lVar45 != 5);
            lVar44 = lVar44 + 1;
            paiVar52 = paiVar52 + 1;
            paiVar61 = paiVar61 + 1;
            paaaaadVar40 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar40)[0][0][0] + 1);
          } while (lVar44 != 5);
          lVar9 = lVar9 + 1;
          paiVar35 = paiVar35 + 5;
          paiVar60 = paiVar60 + 5;
          paaaaadVar39 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar39)[0][0] + 1);
        } while (lVar9 != 5);
        lVar55 = lVar55 + 1;
        paiVar53 = paiVar53 + 0x19;
        paiVar59 = paiVar59 + 0x19;
        paaaaadVar38 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar38)[0] + 1);
      } while (lVar55 != 5);
      lVar47 = lVar47 + 1;
      paiVar31 = paiVar31 + 0x7d;
      paiVar42 = paiVar42 + 0x7d;
      paaaaadVar37 = (double (*) [8] [5] [5] [5] [5])(*paaaaadVar37 + 1);
    } while (lVar47 != 8);
    lVar6 = lVar6 + 1;
    paaaaaiVar51 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar51 + 20000);
    paaaaaiVar58 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar58 + 20000);
    paaaaadVar36 = paaaaadVar36 + 1;
  } while (lVar6 != 8);
  strncpy(pvVar5->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar5->Triloops,Triloops,0xf1);
  strncpy(pvVar5->Hexaloops,Hexaloops,0x169);
  return pvVar5;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_exp_params_ali(vrna_md_t    *md,
                   unsigned int n_seq,
                   double       pfs)
{
  /* scale energy parameters and pre-calculate Boltzmann weights */
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kTn, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf                = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
  pf->model_details = *md;
  pf->alpha         = md->betaScale;
  pf->temperature   = md->temperature;
  pf->pf_scale      = pfs;
  pf->kT            = kTn = ((double)n_seq) * md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kTn);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kTn);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kTn / n_seq);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kTn);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kTn);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kTn);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kTn);
  /*add penalty for too short hairpins*/
  for (i = 0; i < 3; i++) {
    GT                = 600 /*Penalty*/ * TT;
    pf->exphairpin[i] = exp(-GT * 10. / kTn);
  }

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kTn);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kTn);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kTn);

  GT = RESCALE_dG(bulge37[30], bulgedH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(internal_loop37[30], internal_loopdH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * GT) * 10. / kTn);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kTn);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kTn);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kTn);

  for (i = 0; i <= NBPAIRS; i++)
    /* includes AU penalty */
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kTn);

  /* if dangle_model==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j] = RESCALE_BF_SMOOTH(dangle5_37[i][j],
                                                 dangle5_dH[i][j],
                                                 TT,
                                                 kTn);
        pf->expdangle3[i][j] = RESCALE_BF_SMOOTH(dangle3_37[i][j],
                                                 dangle3_dH[i][j],
                                                 TT,
                                                 kTn);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++) {
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j],
                                      stackdH[i][j],
                                      TT,
                                      kTn);
    }

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kTn);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kTn);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kTn);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kTn);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kTn);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kTn);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kTn);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}